

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O1

exr_result_t DwaCompressor_setupChannelData(DwaCompressor *me)

{
  char cVar1;
  CompressorScheme CVar2;
  ChannelData *pCVar3;
  exr_coding_channel_info_t *peVar4;
  uint8_t *puVar5;
  int i;
  int iVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  long alStack_48 [3];
  uint8_t *planarUncBuffer [3];
  
  lVar7 = 0;
  do {
    alStack_48[lVar7] = 0;
    alStack_48[lVar7] = (long)me->_planarUncBuffer[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 3);
  iVar6 = me->_numChannels;
  lVar7 = (long)iVar6;
  if (0 < lVar7) {
    lVar9 = 0x1d8;
    lVar10 = 0x200;
    lVar12 = 0;
    do {
      pCVar3 = me->_channelData;
      peVar4 = pCVar3[lVar12].chan;
      lVar11 = (long)peVar4->height * (long)peVar4->width;
      cVar1 = peVar4->bytes_per_element;
      lVar14 = (long)cVar1;
      sVar13 = lVar11 * lVar14;
      pCVar3[lVar12].planarUncSize = sVar13;
      CVar2 = pCVar3[lVar12].compression;
      puVar5 = (uint8_t *)alStack_48[CVar2];
      pCVar3[lVar12].planarUncBuffer = puVar5;
      pCVar3[lVar12].planarUncBufferEnd = puVar5;
      pCVar3[lVar12].planarUncRle[0] = puVar5;
      pCVar3[lVar12].planarUncRleEnd[0] = puVar5;
      if (puVar5 == (uint8_t *)0x0) {
        if ('\x01' < cVar1) {
          lVar11 = 0;
          do {
            *(undefined8 *)((long)(pCVar3->_dctData)._dctData + lVar11 * 8 + lVar10 + -0x20) = 0;
            *(undefined8 *)((long)(pCVar3->_dctData)._dctData + lVar11 * 8 + lVar10) = 0;
            lVar11 = lVar11 + 1;
          } while (lVar14 + -1 != lVar11);
        }
      }
      else if ('\x01' < cVar1) {
        lVar8 = 0;
        do {
          lVar15 = *(long *)((long)(pCVar3->_dctData)._dctData + lVar8 * 8 + lVar9) + lVar11;
          *(long *)((long)(pCVar3->_dctData)._dctData + lVar8 * 8 + lVar9 + 8) = lVar15;
          *(long *)((long)(pCVar3->_dctData)._dctData + lVar8 * 8 + lVar9 + 0x28) = lVar15;
          lVar8 = lVar8 + 1;
        } while (lVar14 + -1 != lVar8);
      }
      pCVar3[lVar12].planarUncType = (uint)peVar4->data_type;
      if (CVar2 == LOSSY_DCT) {
        pCVar3[lVar12].planarUncType = EXR_PIXEL_FLOAT;
      }
      else {
        alStack_48[CVar2] = (long)(puVar5 + sVar13);
      }
      lVar12 = lVar12 + 1;
      iVar6 = 0x240;
      lVar9 = lVar9 + 0x240;
      lVar10 = lVar10 + 0x240;
    } while (lVar12 != lVar7);
  }
  return iVar6;
}

Assistant:

exr_result_t
DwaCompressor_setupChannelData (DwaCompressor* me)
{
    uint8_t* planarUncBuffer[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        planarUncBuffer[i] = 0;

        if (me->_planarUncBuffer[i])
            planarUncBuffer[i] = me->_planarUncBuffer[i];
    }

    for (int c = 0; c < me->_numChannels; ++c)
    {
        ChannelData*                     cd   = me->_channelData + c;
        const exr_coding_channel_info_t* curc = cd->chan;
        size_t                           uncSize;

        uncSize = (size_t) curc->width * (size_t) curc->height *
                  (size_t) curc->bytes_per_element;
        cd->planarUncSize = uncSize;

        cd->planarUncBuffer    = planarUncBuffer[cd->compression];
        cd->planarUncBufferEnd = cd->planarUncBuffer;

        cd->planarUncRle[0]    = cd->planarUncBuffer;
        cd->planarUncRleEnd[0] = cd->planarUncRle[0];

        if (!cd->planarUncBuffer)
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte]    = 0;
                cd->planarUncRleEnd[byte] = 0;
            }
        }
        else
        {
            for (int byte = 1; byte < curc->bytes_per_element; ++byte)
            {
                cd->planarUncRle[byte] =
                    cd->planarUncRle[byte - 1] + curc->width * curc->height;

                cd->planarUncRleEnd[byte] = cd->planarUncRle[byte];
            }
        }

        cd->planarUncType = (exr_pixel_type_t) curc->data_type;

        if (cd->compression == LOSSY_DCT)
        {
            cd->planarUncType = EXR_PIXEL_FLOAT;
        }
        else { planarUncBuffer[cd->compression] += uncSize; }
    }

    return EXR_ERR_SUCCESS;
}